

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sspm.cpp
# Opt level: O3

void __thiscall pg::SSPMSolver::stream_tmp(SSPMSolver *this,ostream *out,int h)

{
  ostream *this_00;
  int iVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  
  if (*this->tmp_d == -1) {
    pcVar4 = " \x1b[1;33mTop\x1b[m";
    lVar7 = 0xe;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(out," { ",3);
    if (h < 1) {
      std::__ostream_insert<char,std::char_traits<char>>(out," }",2);
      std::__ostream_insert<char,std::char_traits<char>>(out," {",2);
    }
    else {
      iVar1 = 0;
      iVar8 = 0;
      do {
        if (iVar1 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(out,",",1);
        }
        if (iVar8 < this->l) {
          lVar7 = (long)iVar8;
          iVar9 = 0;
          do {
            if (this->tmp_d[lVar7] != iVar1) {
              iVar8 = iVar8 - iVar9;
              if (iVar9 != 0) goto LAB_00166987;
              goto LAB_00166973;
            }
            std::ostream::_M_insert<bool>(SUB81(out,0));
            lVar7 = lVar7 + 1;
            iVar9 = iVar9 + -1;
          } while (lVar7 < this->l);
          iVar8 = iVar8 - iVar9;
        }
        else {
LAB_00166973:
          std::__ostream_insert<char,std::char_traits<char>>(out,anon_var_dwarf_230e1b,2);
        }
LAB_00166987:
        iVar1 = iVar1 + 1;
      } while (iVar1 != h);
      std::__ostream_insert<char,std::char_traits<char>>(out," }",2);
      std::__ostream_insert<char,std::char_traits<char>>(out," {",2);
      if (0 < h) {
        iVar8 = 0;
        iVar1 = 0;
        do {
          iVar9 = this->l;
          if (iVar1 < iVar9) {
            uVar3 = (ulong)iVar1;
            iVar2 = -iVar1;
            uVar6 = 0;
            do {
              if (this->tmp_d[uVar3] != iVar8) {
                uVar6 = uVar6 | ~(-1 << (iVar9 + iVar2 & 0x1fU));
                iVar1 = -iVar2;
                break;
              }
              uVar5 = 1 << (iVar9 + iVar2 & 0x1fU);
              if (((this->tmp_b)._bits[uVar3 >> 6] >> (uVar3 & 0x3f) & 1) == 0) {
                uVar5 = 0;
              }
              iVar2 = iVar2 + -1;
              uVar3 = uVar3 + 1;
              uVar6 = uVar6 | uVar5;
              iVar1 = iVar9;
            } while (iVar9 + iVar2 != 0);
          }
          else {
            uVar6 = 0;
          }
          this_00 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>(this_00," ",1);
          std::ostream::operator<<(this_00,uVar6);
          iVar8 = iVar8 + 1;
        } while (iVar8 != h);
      }
    }
    pcVar4 = " }";
    lVar7 = 2;
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,pcVar4,lVar7);
  return;
}

Assistant:

void
SSPMSolver::stream_tmp(std::ostream &out, int h)
{
    if (tmp_d[0] == -1) {
        out << " \033[1;33mTop\033[m";
    } else {
        out << " { ";
        int j=0;
        for (int i=0; i<h; i++) {
            if (i>0) out << ",";
            int c=0;
            while (j<l and tmp_d[j] == i) {
                c++;
                out << tmp_b[j];
                j++;
            }
            if (c == 0) out << "ε";
        }
        out << " }";

        out << " {";

        // compute value
        int i=0;
        for (int d=0; d<h; d++) {
            int val = 0;

            for (; i<l; i++) {
                if (tmp_d[i] != d) {
                    // e found
                    val |= ((1 << (l-i)) - 1);
                    break;
                }

                if (tmp_b[i]) val |= (1 << (l-i));
            }

            logger << " " << val;
        }

        out << " }";
    }
}